

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer puVar2;
  cmMakefile *this_00;
  cmExternalMakefileProjectGenerator *pcVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  bool bVar6;
  long lVar7;
  _Base_ptr p_Var8;
  ostream *poVar9;
  PolicyID id;
  PolicyID id_00;
  uint uVar10;
  ulong uVar11;
  string local_1e8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1c8;
  long local_1b8;
  long local_1b0;
  ostringstream msg;
  
  lVar7 = std::chrono::_V2::steady_clock::now();
  (*this->_vptr_cmGlobalGenerator[0x41])(this);
  ProcessEvaluationFiles(this);
  pcVar1 = this->CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"Generating",(allocator<char> *)&local_1e8);
  cmake::UpdateProgress(pcVar1,(string *)&msg,0.1);
  std::__cxx11::string::~string((string *)&msg);
  bVar6 = cmQtAutoGenGlobalInitializer::SetupCustomTargets
                    ((this->QtAutoGen)._M_t.
                     super___uniq_ptr_impl<cmQtAutoGenGlobalInitializer,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmQtAutoGenGlobalInitializer_*,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
                     .super__Head_base<0UL,_cmQtAutoGenGlobalInitializer_*,_false>._M_head_impl);
  if (bVar6) {
    uVar10 = 0;
    local_1b8 = lVar7;
    while( true ) {
      uVar11 = (ulong)uVar10;
      puVar2 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar11)
      break;
      this->CurrentConfigureMakefile =
           *(cmMakefile **)
            ((long)puVar2[uVar11]._M_t.
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t + 0x70);
      (**(code **)(*(long *)puVar2[uVar11]._M_t.
                            super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                            ._M_t + 0x18))();
      this_00 = *(cmMakefile **)
                 ((long)(this->LocalGenerators).
                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t + 0x70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"CMAKE_SKIP_INSTALL_RULES",(allocator<char> *)&local_1e8);
      bVar6 = cmMakefile::IsOn(this_00,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      if (!bVar6) {
        cmLocalGenerator::GenerateInstallRules
                  ((cmLocalGenerator *)
                   (this->LocalGenerators).
                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t);
      }
      cmLocalGenerator::GenerateTestFiles
                ((cmLocalGenerator *)
                 (this->LocalGenerators).
                 super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t);
      pcVar1 = this->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"Generating",(allocator<char> *)&local_1e8);
      cmake::UpdateProgress
                (pcVar1,(string *)&msg,
                 (((float)uVar11 + 1.0) * 0.9) /
                 (float)(ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->LocalGenerators).
                                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) + 0.1);
      std::__cxx11::string::~string((string *)&msg);
      uVar10 = uVar10 + 1;
    }
    this->CurrentConfigureMakefile = (cmMakefile *)0x0;
    GenerateCPackPropertiesFile(this);
    for (p_Var8 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      bVar6 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var8 + 2));
      if (!bVar6) {
        bVar6 = cmSystemTools::GetErrorOccurredFlag();
        if (bVar6) {
          return;
        }
        pcVar1 = this->CMakeInstance;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"Could not write export file.",(allocator<char> *)&local_1c8);
        local_1e8._M_dataplus._M_p = (pointer)0x0;
        local_1e8._M_string_length = 0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1e8);
        cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)&msg,(cmListFileBacktrace *)&local_1e8);
        goto LAB_0041c841;
      }
    }
    CheckRuleHashes(this);
    WriteSummary(this);
    pcVar3 = (this->ExtraGenerator)._M_t.
             super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
    if (pcVar3 != (cmExternalMakefileProjectGenerator *)0x0) {
      (*pcVar3->_vptr_cmExternalMakefileProjectGenerator[4])();
    }
    CheckTargetLinkLibraries(this);
    if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x2a,id);
      poVar9 = std::operator<<((ostream *)&msg,(string *)&local_1e8);
      std::operator<<(poVar9,"\n");
      std::__cxx11::string::~string((string *)&local_1e8);
      std::operator<<((ostream *)&msg,"MACOSX_RPATH is not specified for the following targets:\n");
      for (p_Var8 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 !=
          &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        poVar9 = std::operator<<((ostream *)&msg," ");
        poVar9 = std::operator<<(poVar9,(string *)(p_Var8 + 1));
        std::operator<<(poVar9,"\n");
      }
      pcVar1 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_1c8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_1c8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1c8);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1e8,(cmListFileBacktrace *)&local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1c8.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    }
    if ((this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x44,id_00);
      poVar9 = std::operator<<((ostream *)&msg,(string *)&local_1e8);
      std::operator<<(poVar9,
                      "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                     );
      std::__cxx11::string::~string((string *)&local_1e8);
      for (p_Var8 = (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 !=
          &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        poVar9 = std::operator<<((ostream *)&msg," ");
        poVar9 = std::operator<<(poVar9,(string *)(p_Var8 + 1));
        std::operator<<(poVar9,"\n");
      }
      pcVar1 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_1c8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_1c8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1c8);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1e8,(cmListFileBacktrace *)&local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1c8.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    }
    lVar7 = std::chrono::_V2::steady_clock::now();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar9 = std::operator<<((ostream *)&msg,"Generating done (");
    local_1b0 = (lVar7 - local_1b8) / 1000000;
    pp_Var4 = poVar9->_vptr_basic_ostream;
    p_Var5 = pp_Var4[-3];
    *(uint *)(&poVar9->field_0x18 + (long)p_Var5) =
         *(uint *)(&poVar9->field_0x18 + (long)p_Var5) & 0xfffffefb | 4;
    *(undefined8 *)(&poVar9->field_0x8 + (long)pp_Var4[-3]) = 1;
    poVar9 = std::ostream::_M_insert<long_double>((longdouble)local_1b0 / (longdouble)1000.0);
    std::operator<<(poVar9,"s)");
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar1,&local_1e8,-1.0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    bVar6 = cmSystemTools::GetErrorOccurredFlag();
    if (!bVar6) {
      pcVar1 = this->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"Problem setting up custom targets for QtAutoGen",
                 (allocator<char> *)&local_1c8);
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1e8);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)&msg,(cmListFileBacktrace *)&local_1e8);
LAB_0041c841:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  auto startTime = std::chrono::steady_clock::now();

  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  this->CMakeInstance->UpdateProgress("Generating", 0.1f);

#ifndef CMAKE_BOOTSTRAP
  if (!this->QtAutoGen->SetupCustomTargets()) {
    if (!cmSystemTools::GetErrorOccurredFlag()) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Problem setting up custom targets for QtAutoGen");
    }
    return;
  }
#endif

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      0.1f +
        0.9f * (static_cast<float>(i) + 1.0f) /
          static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccurredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  // Perform validation checks on memoized link structures.
  this->CheckTargetLinkLibraries();

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  auto endTime = std::chrono::steady_clock::now();
  auto ms =
    std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime);
  std::ostringstream msg;
  msg << "Generating done (" << std::fixed << std::setprecision(1)
      << ms.count() / 1000.0L << "s)";
  this->CMakeInstance->UpdateProgress(msg.str(), -1);
}